

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

long * __thiscall
google::protobuf::RepeatedField<long>::AddAlreadyReserved(RepeatedField<long> *this)

{
  int iVar1;
  
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  return (long *)((long)iVar1 * 8 + (long)this->arena_or_elements_);
}

Assistant:

inline Element* RepeatedField<Element>::AddAlreadyReserved() {
  GOOGLE_DCHECK_LT(current_size_, total_size_);
  return &elements()[current_size_++];
}